

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  uint uVar3;
  int iVar4;
  _func_void_int_int *p_Var5;
  char *__s1;
  ImGuiWindow **ppIVar6;
  unsigned_short *puVar7;
  bool bVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImU32 key;
  int iVar13;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar14;
  ImGuiWindow **ppIVar15;
  unsigned_short *__dest;
  byte bVar16;
  char *pcVar17;
  char *label;
  ImGuiContext *g;
  ImGuiContext *pIVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var5 = (GImGui->IO).ImeSetInputScreenPosFn;
  local_38 = in_RAX;
  if (p_Var5 != (_func_void_int_int *)0x0) {
    fVar24 = (GImGui->PlatformImePos).x;
    fVar25 = (GImGui->PlatformImePos).y;
    fVar26 = (GImGui->PlatformImeLastPos).x - fVar24;
    fVar27 = (GImGui->PlatformImeLastPos).y - fVar25;
    if (0.0001 < fVar26 * fVar26 + fVar27 * fVar27) {
      (*p_Var5)((int)fVar24,(int)fVar25);
      pIVar11->PlatformImeLastPos = pIVar11->PlatformImePos;
    }
  }
  iVar13 = (pIVar11->CurrentWindowStack).Size;
  while (1 < iVar13) {
    End();
    iVar13 = (pIVar11->CurrentWindowStack).Size;
  }
  pIVar11->FrameScopePushedImplicitWindow = false;
  pIVar14 = pIVar11->CurrentWindow;
  if ((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->WriteAccessed == false)) {
    pIVar14->Active = false;
  }
  End();
  pIVar12 = GImGui;
  if ((pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    pIVar18 = GImGui;
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      key = ImHash("###NavWindowingList",0,0);
      pIVar18 = GImGui;
      pIVar14 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
      pIVar12->NavWindowingList = pIVar14;
    }
    (pIVar18->NextWindowData).SizeConstraintCond = 1;
    IVar2 = (pIVar12->IO).DisplaySize;
    IVar9.y = IVar2.y * 0.2;
    IVar9.x = IVar2.x * 0.2;
    (pIVar18->NextWindowData).SizeConstraintRect.Min = IVar9;
    (pIVar18->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar18->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar18->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar18->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = (pIVar12->IO).DisplaySize;
    IVar10.y = IVar2.y * 0.5;
    IVar10.x = IVar2.x * 0.5;
    (pIVar18->NextWindowData).PosVal = IVar10;
    (pIVar18->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar18->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar18->NextWindowData).PosCond = 1;
    IVar2 = (pIVar12->Style).WindowPadding;
    fVar24 = IVar2.x;
    fVar25 = IVar2.y;
    local_38.y = fVar25 + fVar25;
    local_38.x = fVar24 + fVar24;
    PushStyleVar(1,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar22 = (long)(pIVar12->WindowsFocusOrder).Size;
    if (0 < lVar22) {
      do {
        pIVar14 = (pIVar12->WindowsFocusOrder).Data[lVar22 + -1];
        if (((pIVar14->Active == true) && (pIVar14->RootWindow == pIVar14)) &&
           (uVar20 = pIVar14->Flags, (uVar20 >> 0x13 & 1) == 0)) {
          __s1 = pIVar14->Name;
          pcVar17 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00125fc2:
            label = "(Popup)";
            if ((uVar20 >> 0x1a & 1) == 0) {
              if ((uVar20 >> 10 & 1) != 0) {
                iVar13 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar13 == 0) goto LAB_00125fef;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar17 == '#') {
                if (pcVar17[1] == '#') goto LAB_00125fb8;
              }
              else if (*pcVar17 == '\0') goto LAB_00125fb8;
              pcVar17 = pcVar17 + 1;
            } while (pcVar17 != (char *)0xffffffffffffffff);
            pcVar17 = (char *)0xffffffffffffffff;
LAB_00125fb8:
            label = __s1;
            if (__s1 == pcVar17) goto LAB_00125fc2;
          }
LAB_00125fef:
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(label,pIVar12->NavWindowingTarget == pIVar14,0,&local_38);
        }
        bVar8 = 1 < lVar22;
        lVar22 = lVar22 + -1;
      } while (bVar8);
    }
    End();
    PopStyleVar(1);
  }
  bVar16 = pIVar11->DragDropActive;
  iVar13 = pIVar11->FrameCount;
  if ((bool)bVar16 != true) goto LAB_0012609d;
  if ((pIVar11->DragDropPayload).DataFrameCount + 1 < iVar13) {
    if ((pIVar11->DragDropSourceFlags & 0x20) == 0) {
      bVar19 = (GImGui->IO).MouseDown[pIVar11->DragDropMouseButton] ^ 1;
      goto LAB_00126081;
    }
  }
  else {
    bVar19 = 0;
LAB_00126081:
    if ((bVar19 == 0) && ((pIVar11->DragDropPayload).Delivery == false)) goto LAB_0012609d;
  }
  ClearDragDrop();
  bVar16 = pIVar11->DragDropActive;
  iVar13 = pIVar11->FrameCount;
LAB_0012609d:
  if (((bVar16 & 1) != 0) && (pIVar11->DragDropSourceFrameCount < iVar13)) {
    pIVar11->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar11->DragDropWithinSourceOrTarget = false;
    iVar13 = pIVar11->FrameCount;
  }
  pIVar11->FrameScopeActive = false;
  pIVar11->FrameCountEnded = iVar13;
  UpdateMouseMovingWindowEndFrame();
  uVar20 = (pIVar11->WindowsSortBuffer).Capacity;
  if ((int)uVar20 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar20 = 0;
    ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar6 = (pIVar11->WindowsSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar15,ppIVar6,(long)(pIVar11->WindowsSortBuffer).Size << 3);
      ppIVar6 = (pIVar11->WindowsSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar11->WindowsSortBuffer).Data = ppIVar15;
    (pIVar11->WindowsSortBuffer).Capacity = 0;
  }
  (pIVar11->WindowsSortBuffer).Size = 0;
  uVar3 = (pIVar11->Windows).Size;
  uVar23 = (ulong)uVar3;
  if ((int)uVar20 < (int)uVar3) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar23 * 8,GImAllocatorUserData);
    ppIVar6 = (pIVar11->WindowsSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar15,ppIVar6,(long)(pIVar11->WindowsSortBuffer).Size << 3);
      ppIVar6 = (pIVar11->WindowsSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar11->WindowsSortBuffer).Data = ppIVar15;
    (pIVar11->WindowsSortBuffer).Capacity = uVar3;
    uVar23 = (ulong)(uint)(pIVar11->Windows).Size;
    uVar20 = uVar3;
  }
  if ((int)uVar23 == 0) {
    iVar13 = 0;
  }
  else {
    uVar21 = 0;
    do {
      pIVar14 = (pIVar11->Windows).Data[uVar21];
      if ((pIVar14->Active != true) || ((pIVar14->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar11->WindowsSortBuffer,pIVar14);
        uVar23 = (ulong)(uint)(pIVar11->Windows).Size;
      }
      uVar21 = uVar21 + 1;
      iVar13 = (int)uVar23;
    } while (uVar21 != uVar23);
    uVar20 = (pIVar11->WindowsSortBuffer).Capacity;
  }
  iVar4 = (pIVar11->WindowsSortBuffer).Size;
  (pIVar11->WindowsSortBuffer).Size = iVar13;
  (pIVar11->Windows).Size = iVar4;
  (pIVar11->WindowsSortBuffer).Capacity = (pIVar11->Windows).Capacity;
  (pIVar11->Windows).Capacity = uVar20;
  ppIVar6 = (pIVar11->WindowsSortBuffer).Data;
  (pIVar11->WindowsSortBuffer).Data = (pIVar11->Windows).Data;
  (pIVar11->Windows).Data = ppIVar6;
  (pIVar11->IO).MetricsActiveWindows = pIVar11->WindowsActiveCount;
  ((pIVar11->IO).Fonts)->Locked = false;
  (pIVar11->IO).MouseWheel = 0.0;
  (pIVar11->IO).MouseWheelH = 0.0;
  if ((pIVar11->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar7 = (pIVar11->IO).InputQueueCharacters.Data;
    if (puVar7 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar7,(long)(pIVar11->IO).InputQueueCharacters.Size * 2);
      puVar7 = (pIVar11->IO).InputQueueCharacters.Data;
      if ((puVar7 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
    }
    (pIVar11->IO).InputQueueCharacters.Data = __dest;
    (pIVar11->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar11->IO).InputQueueCharacters.Size = 0;
  (pIVar11->IO).NavInputs[0] = 0.0;
  (pIVar11->IO).NavInputs[1] = 0.0;
  (pIVar11->IO).NavInputs[2] = 0.0;
  (pIVar11->IO).NavInputs[3] = 0.0;
  (pIVar11->IO).NavInputs[4] = 0.0;
  (pIVar11->IO).NavInputs[5] = 0.0;
  (pIVar11->IO).NavInputs[6] = 0.0;
  (pIVar11->IO).NavInputs[7] = 0.0;
  (pIVar11->IO).NavInputs[8] = 0.0;
  (pIVar11->IO).NavInputs[9] = 0.0;
  (pIVar11->IO).NavInputs[10] = 0.0;
  (pIVar11->IO).NavInputs[0xb] = 0.0;
  (pIVar11->IO).NavInputs[0xc] = 0.0;
  (pIVar11->IO).NavInputs[0xd] = 0.0;
  (pIVar11->IO).NavInputs[0xe] = 0.0;
  (pIVar11->IO).NavInputs[0xf] = 0.0;
  (pIVar11->IO).NavInputs[0x10] = 0.0;
  (pIVar11->IO).NavInputs[0x11] = 0.0;
  (pIVar11->IO).NavInputs[0x12] = 0.0;
  (pIVar11->IO).NavInputs[0x13] = 0.0;
  (pIVar11->IO).NavInputs[0x14] = 0.0;
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}